

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_validateTest_Test::TestBody(OpenDDLParserTest_validateTest_Test *this)

{
  bool bVar1;
  FILE *__stream;
  size_type __new_size;
  size_t len;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  vector<char,_std::allocator<char>_> buffer;
  char token [62];
  OpenDDLParser parser;
  AssertHelper local_118;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  string local_100;
  AssertHelper local_e0;
  vector<char,_std::allocator<char>_> local_d8;
  string local_b8;
  char acStack_98 [40];
  OpenDDLParser local_70;
  
  OpenDDLParser::OpenDDLParser(&local_70);
  __stream = fopen("/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/TestData/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016"
                   ,"rb");
  fseek(__stream,0,2);
  __new_size = ftell(__stream);
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&local_d8,__new_size);
  fread(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start,__new_size,1,__stream);
  fclose(__stream);
  OpenDDLParser::setBuffer(&local_70,&local_d8);
  bVar1 = OpenDDLParser::validate(&local_70);
  local_100._M_dataplus._M_p._0_1_ = !bVar1;
  local_100._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&local_100,(AssertionResult *)"result","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x33f,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_110.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_110.ptr_ + 8))();
      }
      local_110.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  OpenDDLParser::clear(&local_70);
  OpenDDLParser::setBuffer(&local_70,&local_d8);
  local_100._M_dataplus._M_p._0_1_ = OpenDDLParser::validate(&local_70);
  local_100._M_string_length = 0;
  if (!(bool)local_100._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&local_100,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x345,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_110.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_110.ptr_ + 8))();
      }
      local_110.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::clear(&local_70);
  builtin_strncpy(acStack_98 + 0x10,"test\"\n    }\n}",0xe);
  builtin_strncpy(acStack_98,"\n    {\n        \"",0x10);
  local_b8.field_2._M_local_buf[0] = 'd';
  local_b8.field_2._M_local_buf[1] = 'e';
  local_b8.field_2._M_local_buf[2] = '1';
  local_b8.field_2._M_local_buf[3] = '\n';
  local_b8.field_2._M_local_buf[4] = '{';
  local_b8.field_2._M_local_buf[5] = '\n';
  local_b8.field_2._M_local_buf[6] = ' ';
  local_b8.field_2._M_local_buf[7] = ' ';
  local_b8.field_2._M_local_buf[8] = ' ';
  local_b8.field_2._M_local_buf[9] = ' ';
  local_b8.field_2._M_local_buf[10] = 's';
  local_b8.field_2._M_local_buf[0xb] = 't';
  local_b8.field_2._M_local_buf[0xc] = 'r';
  local_b8.field_2._M_local_buf[0xd] = 'i';
  local_b8.field_2._M_local_buf[0xe] = 'n';
  local_b8.field_2._M_local_buf[0xf] = 'g';
  local_b8._M_dataplus._M_p = (pointer)0x797274656d6f6547;
  local_b8._M_string_length._0_1_ = 'N';
  local_b8._M_string_length._1_1_ = 'o';
  local_b8._M_string_length._2_1_ = 'd';
  local_b8._M_string_length._3_1_ = 'e';
  local_b8._M_string_length._4_1_ = ' ';
  local_b8._M_string_length._5_1_ = '$';
  local_b8._M_string_length._6_1_ = 'n';
  local_b8._M_string_length._7_1_ = 'o';
  len = strlen((char *)&local_b8);
  OpenDDLParser::setBuffer(&local_70,(char *)&local_b8,len);
  bVar1 = OpenDDLParser::validate(&local_70);
  local_110.ptr_._0_1_ = bVar1;
  local_108.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)&local_110,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x353,(char *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       local_100._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_100._M_dataplus._M_p._1_7_,local_100._M_dataplus._M_p._0_1_) !=
        &local_100.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_100._M_dataplus._M_p._1_7_,local_100._M_dataplus._M_p._0_1_),
                      local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_118.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_118.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
      local_118.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  OpenDDLParser::~OpenDDLParser(&local_70);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, validateTest) {
    OpenDDLParser parser;

    FILE *fileStream = ::fopen(OPENDDL_TEST_DATA "/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016", "rb");
    fseek(fileStream, 0, SEEK_END);
    const size_t size = ::ftell(fileStream);
    std::vector<char> buffer;
    buffer.resize(size);
    ::fread(&buffer[0], size, sizeof(char), fileStream);
    ::fclose(fileStream);

    parser.setBuffer(buffer);
    bool result = parser.validate();
    EXPECT_FALSE(result);

    buffer.clear();
    parser.clear();
    parser.setBuffer(buffer);
    result = parser.validate();
    EXPECT_TRUE(result);

    parser.clear();
    char token[] =
            "GeometryNode $node1\n"
            "{\n"
            "    string\n"
            "    {\n"
            "        \"test\"\n"
            "    }\n"
            "}";

    parser.setBuffer(token, strlen(token));
    result = parser.validate();
    EXPECT_TRUE(result);
}